

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field,
          int index)

{
  byte bVar1;
  Descriptor *pDVar2;
  pointer pcVar3;
  CppStringType CVar4;
  uint32_t uVar5;
  RepeatedField<absl::lts_20250127::Cord> *this_00;
  const_reference this_01;
  RepeatedPtrFieldBase *this_02;
  string *psVar6;
  char *description;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_001f23a4:
    pDVar2 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar7.descriptor,field,"GetRepeatedString");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      GetRepeatedString_abi_cxx11_();
      goto LAB_001f23a4;
    }
    if ((bVar1 & 0x20) != 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (pDVar2,field,"GetRepeatedString",CPPTYPE_STRING);
      }
      if ((bVar1 & 8) == 0) {
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if ((CVar4 != kView) && (CVar4 != kString)) {
          if (CVar4 == kCord) {
            this_00 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                                (this,message,field);
            this_01 = RepeatedField<absl::lts_20250127::Cord>::Get(this_00,index);
            absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
            return __return_storage_ptr__;
          }
          GetRepeatedString_abi_cxx11_();
        }
        this_02 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                             (this,message,field)->super_RepeatedPtrFieldBase;
        psVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           (this_02,index);
      }
      else {
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar6 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                            field->number_,index);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar6->_M_string_length);
      return __return_storage_ptr__;
    }
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetRepeatedString",description);
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        return std::string(GetRepeatedField<absl::Cord>(message, field, index));
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}